

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

void ats1h_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  ulong uVar1;
  uint64_t uVar2;
  long lVar3;
  
  uVar2 = do_ats_write(env,value,ri->opc2 & MMU_DATA_STORE,ARMMMUIdx_E2);
  uVar1 = env->features;
  if ((uVar1 >> 0x21 & 1) != 0) {
    if (env->aarch64 == 0) {
      if ((env->uncached_cpsr & 0x1f) != 0x16) goto LAB_0061bffc;
    }
    else if ((~env->pstate & 0xc) != 0) {
LAB_0061bffc:
      if ((uVar1 & 0x10000000) == 0 && ((env->cp15).scr_el3 & 1) == 0) {
        lVar3 = 0x460;
        goto LAB_0061c016;
      }
      goto LAB_0061c011;
    }
    lVar3 = 0x460;
    if (((uint)uVar1 >> 0x1c & 1) == 0) goto LAB_0061c016;
  }
LAB_0061c011:
  lVar3 = 0x450;
LAB_0061c016:
  *(uint64_t *)((long)env->regs + lVar3) = uVar2;
  return;
}

Assistant:

static void ats1h_write(CPUARMState *env, const ARMCPRegInfo *ri,
                        uint64_t value)
{
    MMUAccessType access_type = ri->opc2 & 1 ? MMU_DATA_STORE : MMU_DATA_LOAD;
    uint64_t par64;

    par64 = do_ats_write(env, value, access_type, ARMMMUIdx_E2);

    A32_BANKED_CURRENT_REG_SET(env, par, par64);
}